

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAddEaRg<(moira::Instr)118,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ushort in_SI;
  int iVar4;
  long *in_RDI;
  int dst;
  int src;
  u32 result;
  u32 data;
  u32 ea;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_14;
  
  uVar2 = in_SI & 7;
  uVar3 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)1,(moira::Size)4,0ul>
                    ((Moira *)((ulong)CONCAT24(in_SI,(int)(uint)in_SI >> 9) & 0x700000007),
                     (int)((ulong)in_RDI >> 0x20),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar1) {
    readD<(moira::Size)4>
              ((Moira *)CONCAT44(local_14,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    addsub<(moira::Instr)118,(moira::Size)4>
              ((Moira *)CONCAT44(uVar2,uVar3),(u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
    prefetch<4ul>((Moira *)CONCAT44(local_14,in_stack_ffffffffffffffd0));
    bVar1 = isMemMode(MODE_AN);
    iVar4 = 2;
    if (bVar1) {
      iVar4 = 0;
    }
    (**(code **)(*in_RDI + 200))(in_RDI,iVar4 + 2);
    writeD<(moira::Size)4>
              ((Moira *)CONCAT44(local_14,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void
Moira::execAddEaRg(u16 opcode)
{
    u32 ea, data, result;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    
    result = addsub<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();
    
    if (S == Long) sync(2 + (isMemMode(M) ? 0 : 2));
    writeD<S>(dst, result);
}